

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O1

void __thiscall Vgm_Emu::Vgm_Emu(Vgm_Emu *this)

{
  equalizer_t e;
  equalizer_t local_68;
  
  Vgm_Emu_Impl::Vgm_Emu_Impl(&this->super_Vgm_Emu_Impl);
  (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.super_Gme_File._vptr_Gme_File =
       (_func_int **)&PTR__Vgm_Emu_0086d200;
  (this->super_Vgm_Emu_Impl).super_Dual_Resampler._vptr_Dual_Resampler =
       (_func_int **)&PTR__Vgm_Emu_0086d2c0;
  this->disable_oversampling_ = false;
  this->psg_rate = 0;
  (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.super_Gme_File.type_ = &gme_vgm_type_
  ;
  (this->super_Vgm_Emu_Impl).super_Classic_Emu.voice_types = Vgm_Emu::types;
  (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.silence_lookahead = 1;
  local_68.d8 = 0.0;
  local_68.d9 = 0.0;
  local_68.d6 = 0.0;
  local_68.d7 = 0.0;
  local_68.d4 = 0.0;
  local_68.d5 = 0.0;
  local_68.d2 = 0.0;
  local_68.d3 = 0.0;
  local_68.treble = -14.0;
  local_68.bass = 80.0;
  Music_Emu::set_equalizer((Music_Emu *)this,&local_68);
  return;
}

Assistant:

Vgm_Emu::Vgm_Emu()
{
	disable_oversampling_ = false;
	psg_rate   = 0;
	set_type( gme_vgm_type );
	
	static int const types [8] = {
		wave_type | 1, wave_type | 0, wave_type | 2, noise_type | 0
	};
	set_voice_types( types );
	
	set_silence_lookahead( 1 ); // tracks should already be trimmed
	
	set_equalizer( make_equalizer( -14.0, 80 ) );
}